

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

void MIR_output_str(MIR_context_t ctx,FILE *f,MIR_str_t str)

{
  byte bVar1;
  ushort **ppuVar2;
  size_t sVar3;
  char *__ptr;
  
  fputc(0x22,(FILE *)f);
  if (str.len != 0) {
    sVar3 = 0;
    do {
      bVar1 = str.s[sVar3];
      if (bVar1 == 0x22) {
        __ptr = "\\\"";
LAB_001393a1:
        fwrite(__ptr,2,1,(FILE *)f);
      }
      else {
        if (bVar1 == 0x5c) {
          __ptr = "\\\\";
          goto LAB_001393a1;
        }
        ppuVar2 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar2 + (long)(char)bVar1 * 2 + 1) & 0x40) == 0) {
          switch(bVar1) {
          case 7:
            __ptr = "\\a";
            break;
          case 8:
            __ptr = "\\b";
            break;
          case 9:
            __ptr = "\\t";
            break;
          case 10:
            __ptr = "\\n";
            break;
          case 0xb:
            __ptr = "\\v";
            break;
          case 0xc:
            __ptr = "\\f";
            break;
          default:
            fprintf((FILE *)f,"\\%03o",(ulong)bVar1);
            goto LAB_001393a9;
          }
          goto LAB_001393a1;
        }
        fputc((int)(char)bVar1,(FILE *)f);
      }
LAB_001393a9:
      sVar3 = sVar3 + 1;
    } while (str.len != sVar3);
  }
  fputc(0x22,(FILE *)f);
  return;
}

Assistant:

void MIR_output_str (MIR_context_t ctx MIR_UNUSED, FILE *f, MIR_str_t str) {
  fprintf (f, "\"");
  for (size_t i = 0; i < str.len; i++)
    if (str.s[i] == '\\')
      fprintf (f, "\\\\");
    else if (str.s[i] == '"')
      fprintf (f, "\\\"");
    else if (isprint (str.s[i]))
      fprintf (f, "%c", str.s[i]);
    else if (str.s[i] == '\n')
      fprintf (f, "\\n");
    else if (str.s[i] == '\t')
      fprintf (f, "\\t");
    else if (str.s[i] == '\v')
      fprintf (f, "\\v");
    else if (str.s[i] == '\a')
      fprintf (f, "\\a");
    else if (str.s[i] == '\b')
      fprintf (f, "\\b");
    else if (str.s[i] == '\f')
      fprintf (f, "\\f");
    else
      fprintf (f, "\\%03o", (unsigned char) str.s[i]);
  fprintf (f, "\"");
}